

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_45a12::MapDriver::bodyInsidePath(MapDriver *this)

{
  bool bVar1;
  long *in_RDI;
  Vec3 bbFront;
  Vec3 bbSide;
  Vec3 *in_stack_fffffffffffffdd8;
  PolylineSegmentedPathwaySegmentRadii *in_stack_fffffffffffffde0;
  PolylineSegmentedPathwaySegmentRadii *pathway;
  Vec3 *in_stack_fffffffffffffde8;
  Vec3 *v;
  Vec3 *in_stack_fffffffffffffdf0;
  Vec3 *this_00;
  bool local_1f9;
  bool local_1;
  
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    (**(code **)(*in_RDI + 0x10))();
    OpenSteer::Vec3::operator*
              (in_stack_fffffffffffffdf0,(float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    (**(code **)(*in_RDI + 0x30))();
    OpenSteer::Vec3::operator*
              (in_stack_fffffffffffffdf0,(float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    (**(code **)(*in_RDI + 0x40))();
    OpenSteer::Vec3::operator-(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    OpenSteer::Vec3::operator+(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    bVar1 = isInsidePathway(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_1f9 = false;
    if (bVar1) {
      this_00 = (Vec3 *)in_RDI[0x1e];
      (**(code **)(*in_RDI + 0x40))();
      OpenSteer::Vec3::operator+(this_00,in_stack_fffffffffffffde8);
      OpenSteer::Vec3::operator+(this_00,in_stack_fffffffffffffde8);
      bVar1 = isInsidePathway(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_1f9 = false;
      if (bVar1) {
        v = (Vec3 *)in_RDI[0x1e];
        (**(code **)(*in_RDI + 0x40))();
        OpenSteer::Vec3::operator+(this_00,v);
        OpenSteer::Vec3::operator-(this_00,v);
        bVar1 = isInsidePathway(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        local_1f9 = false;
        if (bVar1) {
          pathway = (PolylineSegmentedPathwaySegmentRadii *)in_RDI[0x1e];
          (**(code **)(*in_RDI + 0x40))();
          OpenSteer::Vec3::operator-(this_00,v);
          OpenSteer::Vec3::operator-(this_00,v);
          local_1f9 = isInsidePathway(pathway,in_stack_fffffffffffffdd8);
        }
      }
    }
    local_1 = local_1f9;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool bodyInsidePath (void)
        {
            if (demoSelect == 2)
            {
                const Vec3 bbSide = side () * halfWidth;
                const Vec3 bbFront = forward () * halfLength;
                return ( /* path->isInsidePath (position () - bbFront + bbSide) */ isInsidePathway( *path, position () - bbFront + bbSide ) &&
                         /* path->isInsidePath (position () + bbFront + bbSide) */ isInsidePathway( *path, position () + bbFront + bbSide ) &&
                         /* path->isInsidePath (position () + bbFront - bbSide) */ isInsidePathway( *path, position () + bbFront - bbSide ) &&
                         /* path->isInsidePath (position () - bbFront - bbSide) */ isInsidePathway( *path, position () - bbFront - bbSide ) );
            }
            return true;
        }